

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O2

void QtPromisePrivate::PromiseDispatch<void>::
     call<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>,tst_qpromise_finally::fulfilledThrows_void()::__0>
               (QPromiseResolve<void> *resolve,QPromiseReject<void> *reject,
               anon_class_8_1_a8c68091 fn)

{
  QString *this;
  
  this = (QString *)__cxa_allocate_exception(0x18);
  QString::QString(this,"bar");
  __cxa_throw(this,&QString::typeinfo,QString::~QString);
}

Assistant:

static void call(const Resolve& resolve, const Reject& reject, Functor fn, Args&&... args)
    {
        try {
            fn(std::forward<Args>(args)...);
            resolve();
        } catch (...) {
            reject(std::current_exception());
        }
    }